

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Quake(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  int intensity_00;
  int duration_00;
  AActor *activator;
  int tremrad_00;
  FSoundID damrad_00;
  VMValue *pVVar1;
  bool bVar2;
  bool local_5b;
  FSoundID local_58;
  FSoundID local_54;
  FSoundID local_50;
  FSoundID local_4c;
  int local_48;
  FSoundID sound;
  int tremrad;
  int damrad;
  int duration;
  int intensity;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1428,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1428,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  local_5b = true;
  if (activator != (AActor *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1428,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1429,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1429,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  intensity_00 = param[1].field_0.i;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x142a,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x142a,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  duration_00 = param[2].field_0.i;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x142b,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x142b,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  sound.ID = *(int *)&param[3].field_0;
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x142c,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x142c,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_48 = param[4].field_0.i;
  FSoundID::FSoundID(&local_4c);
  if (numparam < 6) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x142d,
                    "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    FSoundID::FSoundID(&local_54,(pVVar1->field_0).i);
    FSoundID::operator=(&local_4c,&local_54);
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x142d,
                    "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    FSoundID::FSoundID(&local_50,param[5].field_0.i);
    FSoundID::operator=(&local_4c,&local_50);
  }
  damrad_00.ID = sound.ID;
  tremrad_00 = local_48;
  FSoundID::FSoundID(&local_58,&local_4c);
  P_StartQuake(activator,0,intensity_00,duration_00,damrad_00.ID,tremrad_00,&local_58);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Quake)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(intensity);
	PARAM_INT		(duration);
	PARAM_INT		(damrad);
	PARAM_INT		(tremrad);
	PARAM_SOUND_DEF	(sound);

	P_StartQuake(self, 0, intensity, duration, damrad, tremrad, sound);
	return 0;
}